

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_bool32 ma_dr_flac__read_streaminfo
                    (ma_dr_flac_read_proc onRead,void *pUserData,ma_dr_flac_streaminfo *pStreamInfo)

{
  ulong uVar1;
  ulong uVar2;
  ushort uVar3;
  size_t sVar4;
  ulong uVar5;
  ma_bool32 mVar6;
  ma_bool32 mVar7;
  ma_uint32 blockSizes;
  ma_uint64 frameSizes;
  ma_uint64 importantProps;
  ma_uint8 md5 [16];
  int local_4c;
  ulong local_48;
  ulong local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  local_48 = 0;
  sVar4 = (*onRead)(pUserData,&local_4c,4);
  mVar6 = 0;
  mVar7 = 0;
  if (sVar4 == 4) {
    sVar4 = (*onRead)(pUserData,&local_48,6);
    mVar7 = mVar6;
    if (sVar4 == 6) {
      sVar4 = (*onRead)(pUserData,&local_40,8);
      if (sVar4 == 8) {
        sVar4 = (*onRead)(pUserData,&local_38,0x10);
        if (sVar4 == 0x10) {
          uVar3 = (ushort)((uint)local_4c >> 8);
          uVar1 = (local_48 & 0xff0000000000) >> 0x18 | (local_48 & 0xff00000000) >> 8 |
                  (local_48 & 0xff000000) << 8 | (local_48 & 0xff0000) << 0x18;
          uVar2 = (local_40 & 0xff000000) << 8;
          uVar5 = uVar2 | (local_40 & 0xff0000) << 0x18 | (local_40 & 0xff00) << 0x28 |
                  local_40 << 0x38;
          pStreamInfo->minBlockSizeInPCMFrames =
               uVar3 & 0xff | (ushort)((uint)(local_4c << 0x18) >> 0x10);
          pStreamInfo->maxBlockSizeInPCMFrames =
               (ushort)(byte)((uint)local_4c >> 0x18) | uVar3 & 0xff00;
          pStreamInfo->minFrameSizeInPCMFrames =
               ((uint)(uVar1 >> 0x20) | (uint)(((local_48 & 0xff00) << 0x28) >> 0x20) |
               (uint)((local_48 << 0x38) >> 0x20)) >> 8;
          pStreamInfo->maxFrameSizeInPCMFrames = (uint)(uVar1 >> 0x10) & 0xffffff;
          pStreamInfo->sampleRate = (uint)(uVar5 >> 0x2c);
          pStreamInfo->channels = ((byte)(uVar5 >> 0x29) & 7) + 1;
          pStreamInfo->bitsPerSample = ((byte)(uVar5 >> 0x24) & 0x1f) + 1;
          pStreamInfo->totalPCMFrameCount =
               local_40 >> 0x38 | (local_40 & 0xff000000000000) >> 0x28 |
               (local_40 & 0xff0000000000) >> 0x18 | (local_40 & 0xff00000000) >> 8 |
               uVar2 & 0xfffffffff;
          *(undefined8 *)pStreamInfo->md5 = local_38;
          *(undefined8 *)(pStreamInfo->md5 + 8) = uStack_30;
          mVar7 = 1;
        }
      }
    }
  }
  return mVar7;
}

Assistant:

static ma_bool32 ma_dr_flac__read_streaminfo(ma_dr_flac_read_proc onRead, void* pUserData, ma_dr_flac_streaminfo* pStreamInfo)
{
    ma_uint32 blockSizes;
    ma_uint64 frameSizes = 0;
    ma_uint64 importantProps;
    ma_uint8 md5[16];
    if (onRead(pUserData, &blockSizes, 4) != 4) {
        return MA_FALSE;
    }
    if (onRead(pUserData, &frameSizes, 6) != 6) {
        return MA_FALSE;
    }
    if (onRead(pUserData, &importantProps, 8) != 8) {
        return MA_FALSE;
    }
    if (onRead(pUserData, md5, sizeof(md5)) != sizeof(md5)) {
        return MA_FALSE;
    }
    blockSizes     = ma_dr_flac__be2host_32(blockSizes);
    frameSizes     = ma_dr_flac__be2host_64(frameSizes);
    importantProps = ma_dr_flac__be2host_64(importantProps);
    pStreamInfo->minBlockSizeInPCMFrames = (ma_uint16)((blockSizes & 0xFFFF0000) >> 16);
    pStreamInfo->maxBlockSizeInPCMFrames = (ma_uint16) (blockSizes & 0x0000FFFF);
    pStreamInfo->minFrameSizeInPCMFrames = (ma_uint32)((frameSizes     &  (((ma_uint64)0x00FFFFFF << 16) << 24)) >> 40);
    pStreamInfo->maxFrameSizeInPCMFrames = (ma_uint32)((frameSizes     &  (((ma_uint64)0x00FFFFFF << 16) <<  0)) >> 16);
    pStreamInfo->sampleRate              = (ma_uint32)((importantProps &  (((ma_uint64)0x000FFFFF << 16) << 28)) >> 44);
    pStreamInfo->channels                = (ma_uint8 )((importantProps &  (((ma_uint64)0x0000000E << 16) << 24)) >> 41) + 1;
    pStreamInfo->bitsPerSample           = (ma_uint8 )((importantProps &  (((ma_uint64)0x0000001F << 16) << 20)) >> 36) + 1;
    pStreamInfo->totalPCMFrameCount      =                ((importantProps & ((((ma_uint64)0x0000000F << 16) << 16) | 0xFFFFFFFF)));
    MA_DR_FLAC_COPY_MEMORY(pStreamInfo->md5, md5, sizeof(md5));
    return MA_TRUE;
}